

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O2

void quicly_streambuf_destroy(quicly_stream_t *stream,int err)

{
  quicly_sendbuf_t *sb;
  
  sb = (quicly_sendbuf_t *)stream->data;
  quicly_sendbuf_dispose(sb);
  ptls_buffer__release_memory((ptls_buffer_t *)(sb + 1));
  free(sb);
  stream->data = (void *)0x0;
  return;
}

Assistant:

void quicly_streambuf_destroy(quicly_stream_t *stream, int err)
{
    quicly_streambuf_t *sbuf = stream->data;

    quicly_sendbuf_dispose(&sbuf->egress);
    ptls_buffer_dispose(&sbuf->ingress);
    free(sbuf);
    stream->data = NULL;
}